

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O2

bool __thiscall
cappuccino::
ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,unsigned_long *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
                  time_point expire_time,allow a)

{
  iterator keyed_position;
  
  keyed_position =
       std::
       _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>,_std::_Select1st<std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>_>
       ::find(&(this->m_keyed_elements)._M_t,key);
  if ((_Rb_tree_header *)keyed_position._M_node ==
      &(this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,value,expire_time);
  }
  else {
    if ((a & update) == 0) {
      return false;
    }
    do_update(this,(keyed_iterator)keyed_position._M_node,value,expire_time);
  }
  return true;
}

Assistant:

auto do_insert_update(
        const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time, allow a) -> bool
    {
        const auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), expire_time);
                return true;
            }
        }
        return false;
    }